

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

option_set * nonius::detail::command_line_options(void)

{
  initializer_list<nonius::detail::option> __l;
  int iVar1;
  option *in_stack_ffffffffffffec20;
  undefined1 in_stack_ffffffffffffec3f;
  string *in_stack_ffffffffffffec40;
  undefined8 ***pppuVar2;
  string *in_stack_ffffffffffffec48;
  undefined8 ***pppuVar3;
  string *in_stack_ffffffffffffec50;
  string *in_stack_ffffffffffffec58;
  iterator poVar4;
  option *in_stack_ffffffffffffec60;
  option *this;
  undefined1 local_114a [2];
  undefined1 local_1148 [40];
  string local_1120 [39];
  allocator local_10f9;
  string local_10f8 [39];
  allocator local_10d1;
  string local_10d0 [32];
  string local_10b0 [39];
  allocator local_1089;
  string local_1088 [39];
  allocator local_1061;
  string local_1060 [39];
  allocator local_1039;
  string local_1038 [32];
  string local_1018 [39];
  allocator local_ff1;
  string local_ff0 [39];
  allocator local_fc9;
  string local_fc8 [39];
  allocator local_fa1;
  string local_fa0 [32];
  string local_f80 [39];
  allocator local_f59;
  string local_f58 [39];
  allocator local_f31;
  string local_f30 [39];
  allocator local_f09;
  string local_f08 [32];
  string local_ee8 [39];
  allocator local_ec1;
  string local_ec0 [39];
  allocator local_e99;
  string local_e98 [39];
  allocator local_e71;
  string local_e70 [39];
  allocator local_e49;
  string local_e48 [39];
  allocator local_e21;
  string local_e20 [39];
  allocator local_df9;
  string local_df8 [39];
  allocator local_dd1;
  string local_dd0 [32];
  string local_db0 [39];
  allocator local_d89;
  string local_d88 [39];
  allocator local_d61;
  string local_d60 [39];
  allocator local_d39;
  string local_d38 [39];
  allocator local_d11;
  string local_d10 [39];
  allocator local_ce9;
  string local_ce8 [39];
  allocator local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [39];
  allocator local_c71;
  string local_c70 [39];
  allocator local_c49;
  string local_c48 [39];
  allocator local_c21;
  string local_c20 [39];
  allocator local_bf9;
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [39];
  allocator local_ba9;
  string local_ba8 [39];
  allocator local_b81;
  string local_b80 [39];
  allocator local_b59;
  string local_b58 [39];
  allocator local_b31;
  string local_b30 [39];
  allocator local_b09;
  string local_b08 [39];
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90 [39];
  allocator local_a69;
  string local_a68 [39];
  allocator local_a41;
  string local_a40 [39];
  allocator local_a19;
  string local_a18 [39];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [39];
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [39];
  allocator local_929;
  string local_928 [39];
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [32];
  string local_8b8 [39];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [55];
  allocator local_831;
  string local_830 [32];
  undefined8 **local_810;
  undefined1 **local_808 [17];
  undefined1 local_780 [136];
  undefined1 local_6f8 [136];
  undefined1 local_670 [136];
  undefined1 local_5e8 [136];
  undefined1 local_560 [136];
  undefined1 local_4d8 [136];
  undefined1 local_450 [136];
  undefined1 local_3c8 [136];
  undefined1 local_340 [136];
  undefined1 local_2b8 [136];
  undefined1 local_230 [136];
  undefined1 local_1a8 [136];
  undefined1 local_120 [136];
  undefined1 local_98 [136];
  undefined8 **local_10;
  undefined8 local_8;
  
  if (command_line_options()::the_options == '\0') {
    iVar1 = __cxa_guard_acquire(&command_line_options()::the_options);
    if (iVar1 != 0) {
      local_114a[1] = 1;
      local_810 = local_808;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_830,"help",&local_831);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_868,"h",&local_869);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_890,"show this help message",&local_891);
      std::__cxx11::string::string(local_8b8);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_780;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8d8,"samples",&local_8d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_900,"s",&local_901);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_928,"number of samples to collect (default: 100)",&local_929);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_950,"SAMPLES",&local_951);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_6f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_978,"resamples",&local_979);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9a0,"rs",&local_9a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_9c8,"number of resamples for the bootstrap (default: 100000)",&local_9c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9f0,"RESAMPLES",&local_9f1);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_670;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a18,"confidence-interval",&local_a19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a40,"ci",&local_a41);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a68,"confidence interval for the bootstrap (between 0 and 1, default: 0.95)",
                 &local_a69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a90,"INTERVAL",&local_a91);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_5e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ab8,"param",&local_ab9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ae0,"p",&local_ae1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b08,"set a benchmark parameter",&local_b09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b30,"PARAM",&local_b31);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_560;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b58,"output",&local_b59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b80,"o",&local_b81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ba8,"output file (default: <stdout>)",&local_ba9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bd0,"FILE",&local_bd1);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_4d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bf8,"reporter",&local_bf9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c20,"r",&local_c21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c48,"reporter to use (default: standard)",&local_c49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c70,"REPORTER",&local_c71);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_450;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c98,"title",&local_c99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cc0,"t",&local_cc1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ce8,"set report title",&local_ce9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d10,"TITLE",&local_d11);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_3c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d38,"no-analysis",&local_d39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d60,"A",&local_d61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d88,"perform only measurements; do not perform any analysis",&local_d89);
      std::__cxx11::string::string(local_db0);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_340;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_dd0,"filter",&local_dd1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_df8,"f",&local_df9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e20,"only run benchmarks whose name matches the regular expression pattern",
                 &local_e21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e48,"PATTERN",&local_e49);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_2b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e70,"list",&local_e71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e98,"l",&local_e99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ec0,"list benchmarks",&local_ec1);
      std::__cxx11::string::string(local_ee8);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_230;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f08,"list-params",&local_f09);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f30,"lp",&local_f31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f58,"list available parameters",&local_f59);
      std::__cxx11::string::string(local_f80);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_1a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fa0,"list-reporters",&local_fa1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fc8,"lr",&local_fc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ff0,"list available reporters",&local_ff1);
      std::__cxx11::string::string(local_1018);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_120;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1038,"verbose",&local_1039);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1060,"v",&local_1061);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1088,"show verbose output (mutually exclusive with -q)",&local_1089);
      std::__cxx11::string::string(local_10b0);
      option::option(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_810 = (undefined8 **)local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10d0,"summary",&local_10d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10f8,"q",&local_10f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1120,"show summary output (mutually exclusive with -v)",
                 (allocator *)(local_1148 + 0x27));
      this = (option *)local_1148;
      std::__cxx11::string::string((string *)this);
      option::option(this,in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec40,
                     (bool)in_stack_ffffffffffffec3f);
      local_114a[1] = 0;
      local_10 = local_808;
      local_8 = 0xf;
      poVar4 = (iterator)local_114a;
      std::allocator<nonius::detail::option>::allocator
                ((allocator<nonius::detail::option> *)0x20bb2d);
      __l._M_len = (size_type)this;
      __l._M_array = poVar4;
      std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::vector
                ((vector<nonius::detail::option,_std::allocator<nonius::detail::option>_> *)
                 in_stack_ffffffffffffec50,__l,(allocator_type *)in_stack_ffffffffffffec48);
      std::allocator<nonius::detail::option>::~allocator
                ((allocator<nonius::detail::option> *)0x20bb5d);
      pppuVar3 = (undefined8 ***)local_808;
      pppuVar2 = &local_10;
      do {
        pppuVar2 = pppuVar2 + -0x11;
        option::~option(in_stack_ffffffffffffec20);
      } while (pppuVar2 != pppuVar3);
      std::__cxx11::string::~string((string *)local_1148);
      std::__cxx11::string::~string(local_1120);
      std::allocator<char>::~allocator((allocator<char> *)(local_1148 + 0x27));
      std::__cxx11::string::~string(local_10f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
      std::__cxx11::string::~string(local_10d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
      std::__cxx11::string::~string(local_10b0);
      std::__cxx11::string::~string(local_1088);
      std::allocator<char>::~allocator((allocator<char> *)&local_1089);
      std::__cxx11::string::~string(local_1060);
      std::allocator<char>::~allocator((allocator<char> *)&local_1061);
      std::__cxx11::string::~string(local_1038);
      std::allocator<char>::~allocator((allocator<char> *)&local_1039);
      std::__cxx11::string::~string(local_1018);
      std::__cxx11::string::~string(local_ff0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
      std::__cxx11::string::~string(local_fc8);
      std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
      std::__cxx11::string::~string(local_fa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
      std::__cxx11::string::~string(local_f80);
      std::__cxx11::string::~string(local_f58);
      std::allocator<char>::~allocator((allocator<char> *)&local_f59);
      std::__cxx11::string::~string(local_f30);
      std::allocator<char>::~allocator((allocator<char> *)&local_f31);
      std::__cxx11::string::~string(local_f08);
      std::allocator<char>::~allocator((allocator<char> *)&local_f09);
      std::__cxx11::string::~string(local_ee8);
      std::__cxx11::string::~string(local_ec0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
      std::__cxx11::string::~string(local_e98);
      std::allocator<char>::~allocator((allocator<char> *)&local_e99);
      std::__cxx11::string::~string(local_e70);
      std::allocator<char>::~allocator((allocator<char> *)&local_e71);
      std::__cxx11::string::~string(local_e48);
      std::allocator<char>::~allocator((allocator<char> *)&local_e49);
      std::__cxx11::string::~string(local_e20);
      std::allocator<char>::~allocator((allocator<char> *)&local_e21);
      std::__cxx11::string::~string(local_df8);
      std::allocator<char>::~allocator((allocator<char> *)&local_df9);
      std::__cxx11::string::~string(local_dd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
      std::__cxx11::string::~string(local_db0);
      std::__cxx11::string::~string(local_d88);
      std::allocator<char>::~allocator((allocator<char> *)&local_d89);
      std::__cxx11::string::~string(local_d60);
      std::allocator<char>::~allocator((allocator<char> *)&local_d61);
      std::__cxx11::string::~string(local_d38);
      std::allocator<char>::~allocator((allocator<char> *)&local_d39);
      std::__cxx11::string::~string(local_d10);
      std::allocator<char>::~allocator((allocator<char> *)&local_d11);
      std::__cxx11::string::~string(local_ce8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
      std::__cxx11::string::~string(local_cc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
      std::__cxx11::string::~string(local_c98);
      std::allocator<char>::~allocator((allocator<char> *)&local_c99);
      std::__cxx11::string::~string(local_c70);
      std::allocator<char>::~allocator((allocator<char> *)&local_c71);
      std::__cxx11::string::~string(local_c48);
      std::allocator<char>::~allocator((allocator<char> *)&local_c49);
      std::__cxx11::string::~string(local_c20);
      std::allocator<char>::~allocator((allocator<char> *)&local_c21);
      std::__cxx11::string::~string(local_bf8);
      std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
      std::__cxx11::string::~string(local_bd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
      std::__cxx11::string::~string(local_ba8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
      std::__cxx11::string::~string(local_b80);
      std::allocator<char>::~allocator((allocator<char> *)&local_b81);
      std::__cxx11::string::~string(local_b58);
      std::allocator<char>::~allocator((allocator<char> *)&local_b59);
      std::__cxx11::string::~string(local_b30);
      std::allocator<char>::~allocator((allocator<char> *)&local_b31);
      std::__cxx11::string::~string(local_b08);
      std::allocator<char>::~allocator((allocator<char> *)&local_b09);
      std::__cxx11::string::~string(local_ae0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
      std::__cxx11::string::~string(local_ab8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
      std::__cxx11::string::~string(local_a90);
      std::allocator<char>::~allocator((allocator<char> *)&local_a91);
      std::__cxx11::string::~string(local_a68);
      std::allocator<char>::~allocator((allocator<char> *)&local_a69);
      std::__cxx11::string::~string(local_a40);
      std::allocator<char>::~allocator((allocator<char> *)&local_a41);
      std::__cxx11::string::~string(local_a18);
      std::allocator<char>::~allocator((allocator<char> *)&local_a19);
      std::__cxx11::string::~string(local_9f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
      std::__cxx11::string::~string(local_9c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
      std::__cxx11::string::~string(local_9a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      std::__cxx11::string::~string(local_950);
      std::allocator<char>::~allocator((allocator<char> *)&local_951);
      std::__cxx11::string::~string(local_928);
      std::allocator<char>::~allocator((allocator<char> *)&local_929);
      std::__cxx11::string::~string(local_900);
      std::allocator<char>::~allocator((allocator<char> *)&local_901);
      std::__cxx11::string::~string(local_8d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      std::__cxx11::string::~string(local_8b8);
      std::__cxx11::string::~string(local_890);
      std::allocator<char>::~allocator((allocator<char> *)&local_891);
      std::__cxx11::string::~string(local_868);
      std::allocator<char>::~allocator((allocator<char> *)&local_869);
      std::__cxx11::string::~string(local_830);
      std::allocator<char>::~allocator((allocator<char> *)&local_831);
      __cxa_atexit(std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::
                   ~vector,&command_line_options::the_options,&__dso_handle);
      __cxa_guard_release(&command_line_options()::the_options);
    }
  }
  return &command_line_options::the_options;
}

Assistant:

inline detail::option_set const& command_line_options() {
            static detail::option_set the_options {
                detail::option("help", "h", "show this help message"),
                detail::option("samples", "s", "number of samples to collect (default: 100)", "SAMPLES"),
                detail::option("resamples", "rs", "number of resamples for the bootstrap (default: 100000)", "RESAMPLES"),
                detail::option("confidence-interval", "ci", "confidence interval for the bootstrap (between 0 and 1, default: 0.95)", "INTERVAL"),
                detail::option("param", "p", "set a benchmark parameter", "PARAM"),
                detail::option("output", "o", "output file (default: <stdout>)", "FILE"),
                detail::option("reporter", "r", "reporter to use (default: standard)", "REPORTER"),
                detail::option("title", "t", "set report title", "TITLE"),
                detail::option("no-analysis", "A", "perform only measurements; do not perform any analysis"),
                detail::option("filter", "f", "only run benchmarks whose name matches the regular expression pattern", "PATTERN"),
                detail::option("list", "l", "list benchmarks"),
                detail::option("list-params", "lp", "list available parameters"),
                detail::option("list-reporters", "lr", "list available reporters"),
                detail::option("verbose", "v", "show verbose output (mutually exclusive with -q)"),
                detail::option("summary", "q", "show summary output (mutually exclusive with -v)")
            };
            return the_options;
        }